

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::getSymmetricKey(SoftHSM *this,SymmetricKey *skey,Token *token,OSObject *key)

{
  byte bVar1;
  int iVar2;
  size_t *in_RCX;
  Token *in_RDX;
  long *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  ByteString keybits;
  bool isKeyPrivate;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  ByteString *in_stack_ffffffffffffff40;
  undefined1 local_b8 [40];
  undefined4 local_90;
  EVP_PKEY_CTX local_80 [40];
  uchar local_58 [47];
  byte local_29;
  size_t *local_28;
  Token *local_20;
  long *local_18;
  CK_RV local_8;
  
  if (in_RSI == (long *)0x0) {
    return 7;
  }
  if (in_RDX == (Token *)0x0) {
    return 7;
  }
  if (in_RCX == (size_t *)0x0) {
    return 7;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_29 = (**(code **)(*in_RCX + 0x20))(in_RCX,2,0);
  local_29 = local_29 & 1;
  ByteString::ByteString((ByteString *)0x166c63);
  if ((local_29 & 1) == 0) {
    (**(code **)(*local_28 + 0x30))(local_b8,local_28,0x11);
    ByteString::operator=
              (in_stack_ffffffffffffff40,
               (ByteString *)
               CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
    ByteString::~ByteString((ByteString *)0x166d56);
  }
  else {
    (**(code **)(*local_28 + 0x30))(local_80,local_28,0x11);
    iVar2 = Token::decrypt(local_20,local_80,local_58,in_RCX,in_R8,in_R9);
    bVar1 = (byte)iVar2 ^ 0xff;
    ByteString::~ByteString((ByteString *)0x166cc9);
    if ((bVar1 & 1) != 0) {
      local_8 = 5;
      goto LAB_00166d9e;
    }
  }
  (**(code **)(*local_18 + 0x18))(local_18,local_58);
  local_8 = 0;
LAB_00166d9e:
  local_90 = 1;
  ByteString::~ByteString((ByteString *)0x166da8);
  return local_8;
}

Assistant:

CK_RV SoftHSM::getSymmetricKey(SymmetricKey* skey, Token* token, OSObject* key)
{
	if (skey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	ByteString keybits;
	if (isKeyPrivate)
	{
		if (!token->decrypt(key->getByteStringValue(CKA_VALUE), keybits))
			return CKR_GENERAL_ERROR;
	}
	else
	{
		keybits = key->getByteStringValue(CKA_VALUE);
	}

	skey->setKeyBits(keybits);

	return CKR_OK;
}